

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strequal.c
# Opt level: O3

int curl_strequal(char *first,char *second)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  
  if (second == (char *)0x0 || first == (char *)0x0) {
    bVar4 = first == (char *)0x0 && second == (char *)0x0;
  }
  else {
    cVar1 = *first;
    if (cVar1 != '\0') {
      pcVar3 = first + 1;
      do {
        cVar1 = Curl_raw_toupper(cVar1);
        cVar2 = Curl_raw_toupper(*second);
        if (cVar1 != cVar2) {
          bVar4 = false;
          goto LAB_0015a1e7;
        }
        second = second + 1;
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != '\0');
    }
    bVar4 = *second == '\0';
  }
LAB_0015a1e7:
  return (int)bVar4;
}

Assistant:

int curl_strequal(const char *first, const char *second)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return casecompare(first, second);

  /* if both pointers are NULL then treat them as equal */
  return NULL == first && NULL == second;
}